

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

void __thiscall
google::protobuf::DynamicMessageFactory::DynamicMessageFactory
          (DynamicMessageFactory *this,DescriptorPool *pool)

{
  PrototypeMap *pPVar1;
  
  (this->super_MessageFactory)._vptr_MessageFactory =
       (_func_int **)&PTR__DynamicMessageFactory_003baa80;
  this->pool_ = pool;
  this->delegate_to_generated_factory_ = false;
  pPVar1 = (PrototypeMap *)operator_new(0x38);
  (pPVar1->map_)._M_h._M_buckets = (__node_base_ptr *)((long)&(pPVar1->map_)._M_h + 0x30);
  *(size_type *)((long)&(pPVar1->map_)._M_h + 8) = 1;
  ((__node_base *)((long)&(pPVar1->map_)._M_h + 0x10))->_M_nxt = (_Hash_node_base *)0x0;
  *(size_type *)((long)&(pPVar1->map_)._M_h + 0x18) = 0;
  ((_Prime_rehash_policy *)((long)&(pPVar1->map_)._M_h + 0x20))->_M_max_load_factor = 1.0;
  *(size_t *)((long)&(pPVar1->map_)._M_h + 0x28) = 0;
  *(__node_base_ptr *)((long)&(pPVar1->map_)._M_h + 0x30) = (__node_base_ptr)0x0;
  (this->prototypes_)._M_t.
  super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory::PrototypeMap,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory::PrototypeMap_*,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
  .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory::PrototypeMap_*,_false>.
  _M_head_impl = pPVar1;
  (this->prototypes_mutex_).mu_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->prototypes_mutex_).mu_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->prototypes_mutex_).mu_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->prototypes_mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->prototypes_mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  return;
}

Assistant:

DynamicMessageFactory::DynamicMessageFactory(const DescriptorPool* pool)
    : pool_(pool),
      delegate_to_generated_factory_(false),
      prototypes_(new PrototypeMap) {}